

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam.c
# Opt level: O3

void la_miam_xoff_ind_format_text(la_vstring *vstr,void *data,int indent)

{
  la_miam_xoff_ind_msg *msg;
  
  if (*data == 0xfff) {
    la_vstring_append_sprintf(vstr,"%*sFile ID: 0xFFF (all)\n",(ulong)(indent + 1),"");
    return;
  }
  la_vstring_append_sprintf(vstr,"%*sFile ID: %u\n",(ulong)(indent + 1),"");
  return;
}

Assistant:

static void la_miam_xoff_ind_format_text(la_vstring *vstr, void const *data, int indent) {
	la_assert(vstr);
	la_assert(data);
	la_assert(indent >= 0);

	la_miam_xoff_ind_msg const *msg = data;
	indent++;
	if(msg->file_id == 0xFFF) {
		LA_ISPRINTF(vstr, indent, "File ID: 0xFFF (all)\n");
	} else {
		LA_ISPRINTF(vstr, indent, "File ID: %u\n", msg->file_id);
	}
}